

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool dock_hierarchy_00;
  bool local_2b;
  bool result;
  bool dock_hierarchy;
  ImGuiWindow *pIStack_28;
  bool popup_hierarchy;
  ImGuiWindow *cur_window;
  ImGuiWindow *ref_window;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  
  pIVar1 = GImGui;
  if ((flags & 0x300U) != 0) {
    __assert_fail("(flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1d94,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  window = GImGui->HoveredWindow;
  pIStack_28 = GImGui->CurrentWindow;
  if (window == (ImGuiWindow *)0x0) {
    g._7_1_ = false;
  }
  else {
    if ((flags & 4U) == 0) {
      if (pIStack_28 == (ImGuiWindow *)0x0) {
        __assert_fail("cur_window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x1d9d,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
      }
      bVar2 = (flags & 8U) == 0;
      dock_hierarchy_00 = (flags & 0x10U) != 0;
      if ((flags & 2U) != 0) {
        pIStack_28 = GetCombinedRootWindow(pIStack_28,bVar2,dock_hierarchy_00);
      }
      if ((flags & 1U) == 0) {
        local_2b = window == pIStack_28;
      }
      else {
        local_2b = IsWindowChildOf(window,pIStack_28,bVar2,dock_hierarchy_00);
      }
      if (local_2b == false) {
        return false;
      }
    }
    bVar2 = IsWindowContentHoverable(window,flags);
    if (bVar2) {
      if (((((flags & 0x80U) == 0) && (pIVar1->ActiveId != 0)) &&
          ((pIVar1->ActiveIdAllowOverlap & 1U) == 0)) && (pIVar1->ActiveId != window->MoveId)) {
        g._7_1_ = false;
      }
      else {
        g._7_1_ = true;
      }
    }
    else {
      g._7_1_ = false;
    }
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        const bool dock_hierarchy = (flags & ImGuiHoveredFlags_DockHierarchy) != 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}